

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_mvpcontrol_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  uint local_18;
  uint32_t newval;
  uint32_t mask;
  target_ulong_conflict arg1_local;
  CPUMIPSState_conflict2 *env_local;
  
  local_18 = 0;
  if ((env->CP0_VPEConf0 & 2U) != 0) {
    local_18 = 0xb;
  }
  if ((env->mvp->CP0_MVPControl & 2U) != 0) {
    local_18 = local_18 | 4;
  }
  env->mvp->CP0_MVPControl = env->mvp->CP0_MVPControl & (local_18 ^ 0xffffffff) | arg1 & local_18;
  return;
}

Assistant:

void helper_mtc0_mvpcontrol(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) {
        mask |= (1 << CP0MVPCo_CPA) | (1 << CP0MVPCo_VPC) |
                (1 << CP0MVPCo_EVP);
    }
    if (env->mvp->CP0_MVPControl & (1 << CP0MVPCo_VPC)) {
        mask |= (1 << CP0MVPCo_STLB);
    }
    newval = (env->mvp->CP0_MVPControl & ~mask) | (arg1 & mask);

    /* TODO: Enable/disable shared TLB, enable/disable VPEs. */

    env->mvp->CP0_MVPControl = newval;
}